

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O3

void aom_hadamard_lp_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  short *psVar8;
  uint uVar9;
  int16_t *piVar10;
  long lVar11;
  short sVar12;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar13 [16];
  short sVar21;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  undefined1 auVar22 [16];
  short sVar30;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar31 [16];
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar48 [16];
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  
  piVar10 = coeff + 0x38;
  lVar11 = 0;
  uVar9 = 0;
  do {
    psVar1 = src_diff + (ulong)((uint)lVar11 & 8) * src_stride + (ulong)(uVar9 & 8);
    psVar2 = psVar1 + src_stride;
    psVar3 = psVar2 + src_stride;
    psVar4 = psVar3 + src_stride;
    psVar5 = psVar4 + src_stride;
    psVar6 = psVar5 + src_stride;
    psVar7 = psVar6 + src_stride;
    psVar8 = psVar7 + src_stride;
    sVar64 = *psVar2 + *psVar1;
    sVar65 = psVar2[1] + psVar1[1];
    sVar66 = psVar2[2] + psVar1[2];
    sVar67 = psVar2[3] + psVar1[3];
    sVar68 = psVar2[4] + psVar1[4];
    sVar69 = psVar2[5] + psVar1[5];
    sVar70 = psVar2[6] + psVar1[6];
    sVar71 = psVar2[7] + psVar1[7];
    sVar21 = *psVar1 - *psVar2;
    sVar23 = psVar1[1] - psVar2[1];
    sVar24 = psVar1[2] - psVar2[2];
    sVar25 = psVar1[3] - psVar2[3];
    sVar26 = psVar1[4] - psVar2[4];
    sVar27 = psVar1[5] - psVar2[5];
    sVar28 = psVar1[6] - psVar2[6];
    sVar29 = psVar1[7] - psVar2[7];
    sVar92 = *psVar4 + *psVar3;
    sVar94 = psVar4[1] + psVar3[1];
    sVar96 = psVar4[2] + psVar3[2];
    sVar98 = psVar4[3] + psVar3[3];
    sVar100 = psVar4[4] + psVar3[4];
    sVar102 = psVar4[5] + psVar3[5];
    sVar104 = psVar4[6] + psVar3[6];
    sVar106 = psVar4[7] + psVar3[7];
    sVar12 = *psVar3 - *psVar4;
    sVar14 = psVar3[1] - psVar4[1];
    sVar15 = psVar3[2] - psVar4[2];
    sVar16 = psVar3[3] - psVar4[3];
    sVar17 = psVar3[4] - psVar4[4];
    sVar18 = psVar3[5] - psVar4[5];
    sVar19 = psVar3[6] - psVar4[6];
    sVar20 = psVar3[7] - psVar4[7];
    sVar72 = *psVar6 + *psVar5;
    sVar73 = psVar6[1] + psVar5[1];
    sVar74 = psVar6[2] + psVar5[2];
    sVar75 = psVar6[3] + psVar5[3];
    sVar76 = psVar6[4] + psVar5[4];
    sVar77 = psVar6[5] + psVar5[5];
    sVar78 = psVar6[6] + psVar5[6];
    sVar79 = psVar6[7] + psVar5[7];
    sVar56 = *psVar5 - *psVar6;
    sVar57 = psVar5[1] - psVar6[1];
    sVar58 = psVar5[2] - psVar6[2];
    sVar59 = psVar5[3] - psVar6[3];
    sVar60 = psVar5[4] - psVar6[4];
    sVar61 = psVar5[5] - psVar6[5];
    sVar62 = psVar5[6] - psVar6[6];
    sVar63 = psVar5[7] - psVar6[7];
    sVar80 = *psVar8 + *psVar7;
    sVar81 = psVar8[1] + psVar7[1];
    sVar82 = psVar8[2] + psVar7[2];
    sVar83 = psVar8[3] + psVar7[3];
    sVar84 = psVar8[4] + psVar7[4];
    sVar85 = psVar8[5] + psVar7[5];
    sVar86 = psVar8[6] + psVar7[6];
    sVar87 = psVar8[7] + psVar7[7];
    sVar47 = *psVar7 - *psVar8;
    sVar49 = psVar7[1] - psVar8[1];
    sVar50 = psVar7[2] - psVar8[2];
    sVar51 = psVar7[3] - psVar8[3];
    sVar52 = psVar7[4] - psVar8[4];
    sVar53 = psVar7[5] - psVar8[5];
    sVar54 = psVar7[6] - psVar8[6];
    sVar55 = psVar7[7] - psVar8[7];
    sVar30 = sVar92 + sVar64;
    sVar32 = sVar94 + sVar65;
    sVar33 = sVar96 + sVar66;
    sVar34 = sVar98 + sVar67;
    sVar35 = sVar100 + sVar68;
    sVar36 = sVar102 + sVar69;
    sVar37 = sVar104 + sVar70;
    sVar38 = sVar106 + sVar71;
    sVar39 = sVar12 + sVar21;
    sVar40 = sVar14 + sVar23;
    sVar41 = sVar15 + sVar24;
    sVar42 = sVar16 + sVar25;
    sVar43 = sVar17 + sVar26;
    sVar44 = sVar18 + sVar27;
    sVar45 = sVar19 + sVar28;
    sVar46 = sVar20 + sVar29;
    sVar64 = sVar64 - sVar92;
    sVar65 = sVar65 - sVar94;
    sVar66 = sVar66 - sVar96;
    sVar67 = sVar67 - sVar98;
    sVar68 = sVar68 - sVar100;
    sVar69 = sVar69 - sVar102;
    sVar70 = sVar70 - sVar104;
    sVar71 = sVar71 - sVar106;
    sVar21 = sVar21 - sVar12;
    sVar23 = sVar23 - sVar14;
    sVar24 = sVar24 - sVar15;
    sVar25 = sVar25 - sVar16;
    sVar26 = sVar26 - sVar17;
    sVar27 = sVar27 - sVar18;
    sVar28 = sVar28 - sVar19;
    sVar29 = sVar29 - sVar20;
    sVar92 = sVar80 + sVar72;
    sVar94 = sVar81 + sVar73;
    sVar96 = sVar82 + sVar74;
    sVar98 = sVar83 + sVar75;
    sVar100 = sVar84 + sVar76;
    sVar89 = sVar85 + sVar77;
    sVar90 = sVar86 + sVar78;
    sVar91 = sVar87 + sVar79;
    sVar93 = sVar47 + sVar56;
    sVar95 = sVar49 + sVar57;
    sVar97 = sVar50 + sVar58;
    sVar99 = sVar51 + sVar59;
    sVar101 = sVar52 + sVar60;
    sVar103 = sVar53 + sVar61;
    sVar105 = sVar54 + sVar62;
    sVar107 = sVar55 + sVar63;
    sVar72 = sVar72 - sVar80;
    sVar73 = sVar73 - sVar81;
    sVar74 = sVar74 - sVar82;
    sVar75 = sVar75 - sVar83;
    sVar76 = sVar76 - sVar84;
    sVar77 = sVar77 - sVar85;
    sVar78 = sVar78 - sVar86;
    sVar79 = sVar79 - sVar87;
    sVar56 = sVar56 - sVar47;
    sVar57 = sVar57 - sVar49;
    sVar58 = sVar58 - sVar50;
    sVar59 = sVar59 - sVar51;
    sVar60 = sVar60 - sVar52;
    sVar61 = sVar61 - sVar53;
    sVar62 = sVar62 - sVar54;
    sVar63 = sVar63 - sVar55;
    sVar12 = sVar92 + sVar30;
    sVar14 = sVar94 + sVar32;
    sVar16 = sVar96 + sVar33;
    sVar15 = sVar98 + sVar34;
    sVar19 = sVar100 + sVar35;
    sVar17 = sVar89 + sVar36;
    sVar47 = sVar90 + sVar37;
    sVar18 = sVar91 + sVar38;
    sVar51 = sVar93 + sVar39;
    sVar85 = sVar95 + sVar40;
    sVar102 = sVar97 + sVar41;
    sVar86 = sVar99 + sVar42;
    sVar54 = sVar101 + sVar43;
    sVar87 = sVar103 + sVar44;
    sVar106 = sVar105 + sVar45;
    sVar88 = sVar107 + sVar46;
    sVar49 = sVar72 + sVar64;
    sVar108 = sVar73 + sVar65;
    sVar104 = sVar74 + sVar66;
    sVar109 = sVar75 + sVar67;
    sVar52 = sVar76 + sVar68;
    sVar110 = sVar77 + sVar69;
    sVar111 = sVar78 + sVar70;
    sVar112 = sVar79 + sVar71;
    sVar50 = sVar56 + sVar21;
    sVar20 = sVar57 + sVar23;
    sVar80 = sVar58 + sVar24;
    sVar81 = sVar59 + sVar25;
    sVar53 = sVar60 + sVar26;
    sVar82 = sVar61 + sVar27;
    sVar83 = sVar62 + sVar28;
    sVar84 = sVar63 + sVar29;
    sVar30 = sVar30 - sVar92;
    sVar32 = sVar32 - sVar94;
    sVar33 = sVar33 - sVar96;
    sVar34 = sVar34 - sVar98;
    sVar35 = sVar35 - sVar100;
    sVar36 = sVar36 - sVar89;
    sVar37 = sVar37 - sVar90;
    sVar38 = sVar38 - sVar91;
    sVar39 = sVar39 - sVar93;
    sVar40 = sVar40 - sVar95;
    sVar41 = sVar41 - sVar97;
    sVar42 = sVar42 - sVar99;
    sVar43 = sVar43 - sVar101;
    sVar44 = sVar44 - sVar103;
    sVar45 = sVar45 - sVar105;
    sVar46 = sVar46 - sVar107;
    sVar64 = sVar64 - sVar72;
    sVar65 = sVar65 - sVar73;
    sVar66 = sVar66 - sVar74;
    sVar67 = sVar67 - sVar75;
    sVar68 = sVar68 - sVar76;
    sVar69 = sVar69 - sVar77;
    sVar70 = sVar70 - sVar78;
    sVar71 = sVar71 - sVar79;
    sVar21 = sVar21 - sVar56;
    sVar23 = sVar23 - sVar57;
    sVar24 = sVar24 - sVar58;
    sVar25 = sVar25 - sVar59;
    sVar26 = sVar26 - sVar60;
    sVar27 = sVar27 - sVar61;
    sVar28 = sVar28 - sVar62;
    sVar29 = sVar29 - sVar63;
    sVar55 = sVar14 + sVar12;
    sVar56 = sVar65 + sVar64;
    sVar57 = sVar32 + sVar30;
    sVar58 = sVar108 + sVar49;
    sVar59 = sVar20 + sVar50;
    sVar60 = sVar23 + sVar21;
    sVar61 = sVar40 + sVar39;
    sVar62 = sVar85 + sVar51;
    sVar12 = sVar12 - sVar14;
    sVar64 = sVar64 - sVar65;
    sVar30 = sVar30 - sVar32;
    sVar49 = sVar49 - sVar108;
    sVar50 = sVar50 - sVar20;
    sVar21 = sVar21 - sVar23;
    sVar39 = sVar39 - sVar40;
    sVar51 = sVar51 - sVar85;
    sVar72 = sVar15 + sVar16;
    sVar73 = sVar67 + sVar66;
    sVar74 = sVar34 + sVar33;
    sVar75 = sVar109 + sVar104;
    sVar76 = sVar81 + sVar80;
    sVar77 = sVar25 + sVar24;
    sVar78 = sVar42 + sVar41;
    sVar79 = sVar86 + sVar102;
    sVar16 = sVar16 - sVar15;
    sVar66 = sVar66 - sVar67;
    sVar33 = sVar33 - sVar34;
    sVar104 = sVar104 - sVar109;
    sVar80 = sVar80 - sVar81;
    sVar24 = sVar24 - sVar25;
    sVar41 = sVar41 - sVar42;
    sVar102 = sVar102 - sVar86;
    sVar32 = sVar17 + sVar19;
    sVar34 = sVar69 + sVar68;
    sVar40 = sVar36 + sVar35;
    sVar42 = sVar110 + sVar52;
    sVar81 = sVar82 + sVar53;
    sVar63 = sVar27 + sVar26;
    sVar65 = sVar44 + sVar43;
    sVar67 = sVar87 + sVar54;
    sVar19 = sVar19 - sVar17;
    sVar68 = sVar68 - sVar69;
    sVar35 = sVar35 - sVar36;
    sVar52 = sVar52 - sVar110;
    sVar53 = sVar53 - sVar82;
    sVar26 = sVar26 - sVar27;
    sVar43 = sVar43 - sVar44;
    sVar54 = sVar54 - sVar87;
    sVar85 = sVar18 + sVar47;
    sVar86 = sVar71 + sVar70;
    sVar87 = sVar38 + sVar37;
    sVar92 = sVar112 + sVar111;
    sVar94 = sVar84 + sVar83;
    sVar96 = sVar29 + sVar28;
    sVar98 = sVar46 + sVar45;
    sVar100 = sVar88 + sVar106;
    sVar47 = sVar47 - sVar18;
    sVar70 = sVar70 - sVar71;
    sVar37 = sVar37 - sVar38;
    sVar111 = sVar111 - sVar112;
    sVar83 = sVar83 - sVar84;
    sVar28 = sVar28 - sVar29;
    sVar45 = sVar45 - sVar46;
    sVar106 = sVar106 - sVar88;
    sVar29 = sVar72 + sVar55;
    sVar36 = sVar73 + sVar56;
    sVar38 = sVar74 + sVar57;
    sVar44 = sVar75 + sVar58;
    sVar46 = sVar76 + sVar59;
    sVar82 = sVar77 + sVar60;
    sVar84 = sVar78 + sVar61;
    sVar69 = sVar79 + sVar62;
    sVar14 = sVar16 + sVar12;
    sVar15 = sVar66 + sVar64;
    sVar17 = sVar33 + sVar30;
    sVar18 = sVar104 + sVar49;
    sVar20 = sVar80 + sVar50;
    sVar23 = sVar24 + sVar21;
    sVar25 = sVar41 + sVar39;
    sVar27 = sVar102 + sVar51;
    sVar55 = sVar55 - sVar72;
    sVar56 = sVar56 - sVar73;
    sVar57 = sVar57 - sVar74;
    sVar58 = sVar58 - sVar75;
    sVar59 = sVar59 - sVar76;
    sVar60 = sVar60 - sVar77;
    sVar61 = sVar61 - sVar78;
    sVar62 = sVar62 - sVar79;
    sVar12 = sVar12 - sVar16;
    sVar64 = sVar64 - sVar66;
    sVar30 = sVar30 - sVar33;
    sVar49 = sVar49 - sVar104;
    sVar50 = sVar50 - sVar80;
    sVar21 = sVar21 - sVar24;
    sVar39 = sVar39 - sVar41;
    sVar51 = sVar51 - sVar102;
    sVar16 = sVar85 + sVar32;
    sVar24 = sVar86 + sVar34;
    sVar33 = sVar87 + sVar40;
    sVar41 = sVar92 + sVar42;
    sVar80 = sVar94 + sVar81;
    sVar72 = sVar96 + sVar63;
    sVar73 = sVar98 + sVar65;
    sVar66 = sVar100 + sVar67;
    sVar74 = sVar47 + sVar19;
    sVar75 = sVar70 + sVar68;
    sVar76 = sVar37 + sVar35;
    sVar77 = sVar111 + sVar52;
    sVar78 = sVar83 + sVar53;
    sVar71 = sVar28 + sVar26;
    sVar79 = sVar45 + sVar43;
    sVar102 = sVar106 + sVar54;
    sVar32 = sVar32 - sVar85;
    sVar34 = sVar34 - sVar86;
    sVar40 = sVar40 - sVar87;
    sVar42 = sVar42 - sVar92;
    sVar81 = sVar81 - sVar94;
    sVar63 = sVar63 - sVar96;
    sVar65 = sVar65 - sVar98;
    sVar67 = sVar67 - sVar100;
    sVar19 = sVar19 - sVar47;
    sVar68 = sVar68 - sVar70;
    sVar35 = sVar35 - sVar37;
    sVar52 = sVar52 - sVar111;
    sVar53 = sVar53 - sVar83;
    sVar26 = sVar26 - sVar28;
    sVar43 = sVar43 - sVar45;
    sVar54 = sVar54 - sVar106;
    piVar10[-0x38] = sVar16 + sVar29;
    piVar10[-0x37] = sVar24 + sVar36;
    piVar10[-0x36] = sVar33 + sVar38;
    piVar10[-0x35] = sVar41 + sVar44;
    piVar10[-0x34] = sVar80 + sVar46;
    piVar10[-0x33] = sVar72 + sVar82;
    piVar10[-0x32] = sVar73 + sVar84;
    piVar10[-0x31] = sVar66 + sVar69;
    piVar10[-0x30] = sVar55 - sVar32;
    piVar10[-0x2f] = sVar56 - sVar34;
    piVar10[-0x2e] = sVar57 - sVar40;
    piVar10[-0x2d] = sVar58 - sVar42;
    piVar10[-0x2c] = sVar59 - sVar81;
    piVar10[-0x2b] = sVar60 - sVar63;
    piVar10[-0x2a] = sVar61 - sVar65;
    piVar10[-0x29] = sVar62 - sVar67;
    piVar10[-0x28] = sVar29 - sVar16;
    piVar10[-0x27] = sVar36 - sVar24;
    piVar10[-0x26] = sVar38 - sVar33;
    piVar10[-0x25] = sVar44 - sVar41;
    piVar10[-0x24] = sVar46 - sVar80;
    piVar10[-0x23] = sVar82 - sVar72;
    piVar10[-0x22] = sVar84 - sVar73;
    piVar10[-0x21] = sVar69 - sVar66;
    piVar10[-0x20] = sVar32 + sVar55;
    piVar10[-0x1f] = sVar34 + sVar56;
    piVar10[-0x1e] = sVar40 + sVar57;
    piVar10[-0x1d] = sVar42 + sVar58;
    piVar10[-0x1c] = sVar81 + sVar59;
    piVar10[-0x1b] = sVar63 + sVar60;
    piVar10[-0x1a] = sVar65 + sVar61;
    piVar10[-0x19] = sVar67 + sVar62;
    piVar10[-0x18] = sVar19 + sVar12;
    piVar10[-0x17] = sVar68 + sVar64;
    piVar10[-0x16] = sVar35 + sVar30;
    piVar10[-0x15] = sVar52 + sVar49;
    piVar10[-0x14] = sVar53 + sVar50;
    piVar10[-0x13] = sVar26 + sVar21;
    piVar10[-0x12] = sVar43 + sVar39;
    piVar10[-0x11] = sVar54 + sVar51;
    piVar10[-0x10] = sVar12 - sVar19;
    piVar10[-0xf] = sVar64 - sVar68;
    piVar10[-0xe] = sVar30 - sVar35;
    piVar10[-0xd] = sVar49 - sVar52;
    piVar10[-0xc] = sVar50 - sVar53;
    piVar10[-0xb] = sVar21 - sVar26;
    piVar10[-10] = sVar39 - sVar43;
    piVar10[-9] = sVar51 - sVar54;
    piVar10[-8] = sVar14 - sVar74;
    piVar10[-7] = sVar15 - sVar75;
    piVar10[-6] = sVar17 - sVar76;
    piVar10[-5] = sVar18 - sVar77;
    piVar10[-4] = sVar20 - sVar78;
    piVar10[-3] = sVar23 - sVar71;
    piVar10[-2] = sVar25 - sVar79;
    piVar10[-1] = sVar27 - sVar102;
    *piVar10 = sVar74 + sVar14;
    piVar10[1] = sVar75 + sVar15;
    piVar10[2] = sVar76 + sVar17;
    piVar10[3] = sVar77 + sVar18;
    piVar10[4] = sVar78 + sVar20;
    piVar10[5] = sVar71 + sVar23;
    piVar10[6] = sVar79 + sVar25;
    piVar10[7] = sVar102 + sVar27;
    piVar10 = piVar10 + 0x40;
    uVar9 = uVar9 + 8;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  uVar9 = 0xfffffff8;
  do {
    auVar48._0_2_ = coeff[0x40] + *coeff;
    auVar48._2_2_ = coeff[0x41] + coeff[1];
    auVar48._4_2_ = coeff[0x42] + coeff[2];
    auVar48._6_2_ = coeff[0x43] + coeff[3];
    auVar48._8_2_ = coeff[0x44] + coeff[4];
    auVar48._10_2_ = coeff[0x45] + coeff[5];
    auVar48._12_2_ = coeff[0x46] + coeff[6];
    auVar48._14_2_ = coeff[0x47] + coeff[7];
    auVar13._0_2_ = *coeff - coeff[0x40];
    auVar13._2_2_ = coeff[1] - coeff[0x41];
    auVar13._4_2_ = coeff[2] - coeff[0x42];
    auVar13._6_2_ = coeff[3] - coeff[0x43];
    auVar13._8_2_ = coeff[4] - coeff[0x44];
    auVar13._10_2_ = coeff[5] - coeff[0x45];
    auVar13._12_2_ = coeff[6] - coeff[0x46];
    auVar13._14_2_ = coeff[7] - coeff[0x47];
    auVar22._0_2_ = coeff[0xc0] + coeff[0x80];
    auVar22._2_2_ = coeff[0xc1] + coeff[0x81];
    auVar22._4_2_ = coeff[0xc2] + coeff[0x82];
    auVar22._6_2_ = coeff[0xc3] + coeff[0x83];
    auVar22._8_2_ = coeff[0xc4] + coeff[0x84];
    auVar22._10_2_ = coeff[0xc5] + coeff[0x85];
    auVar22._12_2_ = coeff[0xc6] + coeff[0x86];
    auVar22._14_2_ = coeff[199] + coeff[0x87];
    auVar31._0_2_ = coeff[0x80] - coeff[0xc0];
    auVar31._2_2_ = coeff[0x81] - coeff[0xc1];
    auVar31._4_2_ = coeff[0x82] - coeff[0xc2];
    auVar31._6_2_ = coeff[0x83] - coeff[0xc3];
    auVar31._8_2_ = coeff[0x84] - coeff[0xc4];
    auVar31._10_2_ = coeff[0x85] - coeff[0xc5];
    auVar31._12_2_ = coeff[0x86] - coeff[0xc6];
    auVar31._14_2_ = coeff[0x87] - coeff[199];
    auVar48 = psraw(auVar48,1);
    auVar13 = psraw(auVar13,1);
    auVar22 = psraw(auVar22,1);
    auVar31 = psraw(auVar31,1);
    *coeff = auVar22._0_2_ + auVar48._0_2_;
    coeff[1] = auVar22._2_2_ + auVar48._2_2_;
    coeff[2] = auVar22._4_2_ + auVar48._4_2_;
    coeff[3] = auVar22._6_2_ + auVar48._6_2_;
    coeff[4] = auVar22._8_2_ + auVar48._8_2_;
    coeff[5] = auVar22._10_2_ + auVar48._10_2_;
    coeff[6] = auVar22._12_2_ + auVar48._12_2_;
    coeff[7] = auVar22._14_2_ + auVar48._14_2_;
    coeff[0x40] = auVar31._0_2_ + auVar13._0_2_;
    coeff[0x41] = auVar31._2_2_ + auVar13._2_2_;
    coeff[0x42] = auVar31._4_2_ + auVar13._4_2_;
    coeff[0x43] = auVar31._6_2_ + auVar13._6_2_;
    coeff[0x44] = auVar31._8_2_ + auVar13._8_2_;
    coeff[0x45] = auVar31._10_2_ + auVar13._10_2_;
    coeff[0x46] = auVar31._12_2_ + auVar13._12_2_;
    coeff[0x47] = auVar31._14_2_ + auVar13._14_2_;
    coeff[0x80] = auVar48._0_2_ - auVar22._0_2_;
    coeff[0x81] = auVar48._2_2_ - auVar22._2_2_;
    coeff[0x82] = auVar48._4_2_ - auVar22._4_2_;
    coeff[0x83] = auVar48._6_2_ - auVar22._6_2_;
    coeff[0x84] = auVar48._8_2_ - auVar22._8_2_;
    coeff[0x85] = auVar48._10_2_ - auVar22._10_2_;
    coeff[0x86] = auVar48._12_2_ - auVar22._12_2_;
    coeff[0x87] = auVar48._14_2_ - auVar22._14_2_;
    coeff[0xc0] = auVar13._0_2_ - auVar31._0_2_;
    coeff[0xc1] = auVar13._2_2_ - auVar31._2_2_;
    coeff[0xc2] = auVar13._4_2_ - auVar31._4_2_;
    coeff[0xc3] = auVar13._6_2_ - auVar31._6_2_;
    coeff[0xc4] = auVar13._8_2_ - auVar31._8_2_;
    coeff[0xc5] = auVar13._10_2_ - auVar31._10_2_;
    coeff[0xc6] = auVar13._12_2_ - auVar31._12_2_;
    coeff[199] = auVar13._14_2_ - auVar31._14_2_;
    coeff = coeff + 8;
    uVar9 = uVar9 + 8;
  } while (uVar9 < 0x38);
  return;
}

Assistant:

void aom_hadamard_lp_16x16_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                                int16_t *coeff) {
  for (int idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    hadamard_lp_8x8_sse2(src_ptr, src_stride, coeff + idx * 64);
  }

  int16_t *t_coeff = coeff;
  for (int idx = 0; idx < 64; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 64));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 128));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 192));

    __m128i b0 = _mm_add_epi16(coeff0, coeff1);
    __m128i b1 = _mm_sub_epi16(coeff0, coeff1);
    __m128i b2 = _mm_add_epi16(coeff2, coeff3);
    __m128i b3 = _mm_sub_epi16(coeff2, coeff3);

    b0 = _mm_srai_epi16(b0, 1);
    b1 = _mm_srai_epi16(b1, 1);
    b2 = _mm_srai_epi16(b2, 1);
    b3 = _mm_srai_epi16(b3, 1);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);

    _mm_store_si128((__m128i *)t_coeff, coeff0);
    _mm_store_si128((__m128i *)(t_coeff + 64), coeff1);
    _mm_store_si128((__m128i *)(t_coeff + 128), coeff2);
    _mm_store_si128((__m128i *)(t_coeff + 192), coeff3);

    t_coeff += 8;
  }
}